

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

ImPlotLimits * ImPlot::GetPlotQuery(ImPlotLimits *__return_storage_ptr__,ImPlotYAxis y_axis)

{
  ImPlotPlot *pIVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ImPlotPoint IVar8;
  ImPlotPoint IVar9;
  
  if (3 < y_axis + 1U) {
    __assert_fail("(y_axis >= -1 && y_axis < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xac1,"ImPlotLimits ImPlot::GetPlotQuery(ImPlotYAxis)");
  }
  pIVar1 = GImPlot->CurrentPlot;
  if (pIVar1 != (ImPlotPlot *)0x0) {
    if (y_axis < 0) {
      y_axis = pIVar1->CurrentYAxis;
    }
    dVar5 = 0.0;
    dVar6 = 0.0;
    uVar3 = 0;
    uVar4 = 0;
    dVar7 = 0.0;
    if (pIVar1->Queried == true) {
      UpdateTransformCache();
      IVar8 = PixelsToPlot((pIVar1->QueryRect).Min.x + (pIVar1->PlotRect).Min.x,
                           (pIVar1->QueryRect).Min.y + (pIVar1->PlotRect).Min.y,y_axis);
      dVar7 = IVar8.x;
      dVar2 = IVar8.y;
      IVar9 = PixelsToPlot((pIVar1->QueryRect).Max.x + (pIVar1->PlotRect).Min.x,
                           (pIVar1->QueryRect).Max.y + (pIVar1->PlotRect).Min.y,y_axis);
      dVar6 = IVar9.x;
      dVar5 = dVar7;
      if (dVar6 <= dVar7) {
        dVar5 = dVar6;
      }
      dVar6 = (double)(~-(ulong)(dVar6 <= dVar7) & (ulong)dVar6 |
                      (ulong)dVar7 & -(ulong)(dVar6 <= dVar7));
      dVar7 = IVar9.y;
      uVar3 = IVar8.y._0_4_;
      uVar4 = IVar8.y._4_4_;
      if (dVar7 <= dVar2) {
        uVar3 = IVar9.y._0_4_;
        uVar4 = IVar9.y._4_4_;
      }
      dVar7 = (double)(~-(ulong)(dVar7 <= dVar2) & (ulong)dVar7 |
                      (ulong)dVar2 & -(ulong)(dVar7 <= dVar2));
    }
    (__return_storage_ptr__->X).Min = dVar5;
    (__return_storage_ptr__->X).Max = dVar6;
    (__return_storage_ptr__->Y).Min = (double)CONCAT44(uVar4,uVar3);
    (__return_storage_ptr__->Y).Max = dVar7;
    return __return_storage_ptr__;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xac2,"ImPlotLimits ImPlot::GetPlotQuery(ImPlotYAxis)");
}

Assistant:

ImPlotLimits GetPlotQuery(ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis >= -1 && y_axis < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!");
    ImPlotPlot& plot = *gp.CurrentPlot;
    y_axis = y_axis >= 0 ? y_axis : gp.CurrentPlot->CurrentYAxis;
    if (!plot.Queried)
        return ImPlotLimits(0,0,0,0);
    UpdateTransformCache();
    ImPlotPoint p1 = PixelsToPlot(plot.QueryRect.Min + plot.PlotRect.Min, y_axis);
    ImPlotPoint p2 = PixelsToPlot(plot.QueryRect.Max + plot.PlotRect.Min, y_axis);
    ImPlotLimits result;
    result.X.Min = ImMin(p1.x, p2.x);
    result.X.Max = ImMax(p1.x, p2.x);
    result.Y.Min = ImMin(p1.y, p2.y);
    result.Y.Max = ImMax(p1.y, p2.y);
    return result;
}